

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewScGenFunc(Lowerer *this,Instr *newScFuncInstr)

{
  Opnd *pOVar1;
  IntConstOpnd *functionBodySlotOpnd;
  RegOpnd *envOpnd;
  Instr *pIVar2;
  
  pOVar1 = IR::Instr::UnlinkSrc1(newScFuncInstr);
  functionBodySlotOpnd = IR::Opnd::AsIntConstOpnd(pOVar1);
  pOVar1 = IR::Instr::UnlinkSrc2(newScFuncInstr);
  envOpnd = IR::Opnd::AsRegOpnd(pOVar1);
  pIVar2 = LoadFunctionBodyAsArgument(this,newScFuncInstr,functionBodySlotOpnd,envOpnd);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,newScFuncInstr,HelperScrFunc_OP_NewScGenFunc,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScGenFunc(IR::Instr * newScFuncInstr)
{
    IR::IntConstOpnd * functionBodySlotOpnd = newScFuncInstr->UnlinkSrc1()->AsIntConstOpnd();
    IR::RegOpnd * envOpnd = newScFuncInstr->UnlinkSrc2()->AsRegOpnd();

    IR::Instr * instrPrev = this->LoadFunctionBodyAsArgument(newScFuncInstr, functionBodySlotOpnd, envOpnd);
    m_lowererMD.ChangeToHelperCall(newScFuncInstr, IR::HelperScrFunc_OP_NewScGenFunc );

    return instrPrev;
}